

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_sasl_outcome(SASL_OUTCOME_HANDLE sasl_outcome)

{
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  AMQP_VALUE result;
  SASL_OUTCOME_HANDLE sasl_outcome_local;
  
  if (sasl_outcome == (SASL_OUTCOME_HANDLE)0x0) {
    sasl_outcome_instance = (SASL_OUTCOME_INSTANCE *)0x0;
  }
  else {
    sasl_outcome_instance = (SASL_OUTCOME_INSTANCE *)amqpvalue_clone(sasl_outcome->composite_value);
  }
  return (AMQP_VALUE)sasl_outcome_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_outcome(SASL_OUTCOME_HANDLE sasl_outcome)
{
    AMQP_VALUE result;

    if (sasl_outcome == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        result = amqpvalue_clone(sasl_outcome_instance->composite_value);
    }

    return result;
}